

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

string * __thiscall
libtorrent::file_error_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,file_error_alert *this)

{
  error_category *peVar1;
  char *pcVar2;
  string sStack_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  torrent_alert::message_abi_cxx11_(&local_38,&this->super_torrent_alert);
  std::operator+(&local_d8,&local_38," ");
  if ((ulong)this->op < 0x2b) {
    pcVar2 = operation_name::names[this->op];
  }
  else {
    pcVar2 = "unknown operation";
  }
  std::operator+(&local_b8,&local_d8,pcVar2);
  std::operator+(&local_98,&local_b8," (");
  pcVar2 = filename(this);
  std::operator+(&local_78,&local_98,pcVar2);
  std::operator+(&local_58,&local_78,") error: ");
  peVar1 = (this->error).cat_;
  (*peVar1->_vptr_error_category[4])(&sStack_118,peVar1,(ulong)(uint)(this->error).val_);
  convert_from_native(&local_f8,&sStack_118);
  std::operator+(__return_storage_ptr__,&local_58,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&sStack_118);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string file_error_alert::message() const
	{
		return torrent_alert::message() + " "
			+ operation_name(op) + " (" + filename()
			+ ") error: " + convert_from_native(error.message());
	}